

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  undefined8 *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  stbi_uc *psVar6;
  byte *pbVar7;
  void *pvVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  stbi_uc **ppsVar12;
  uint uVar13;
  int a;
  int *piVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int local_64;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (10 < uVar2) {
    psVar6 = s->img_buffer;
    if (s->img_buffer_end <= psVar6) {
      if (s->read_from_callbacks == 0) goto LAB_001414a9;
      stbi__refill_buffer(s);
      psVar6 = s->img_buffer;
    }
    s->img_buffer = psVar6 + 1;
    if (*psVar6 != '\b') {
LAB_001414a9:
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar3 = stbi__get16be(s);
    s->img_y = sVar3;
    if (sVar3 == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar3 = stbi__get16be(s);
    s->img_x = sVar3;
    if (sVar3 == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    if (0x1000000 < s->img_y) {
      stbi__g_failure_reason = "too large";
      return 0;
    }
    pbVar11 = s->img_buffer;
    if (s->img_buffer_end <= pbVar11) {
      if (s->read_from_callbacks == 0) goto LAB_0014167e;
      stbi__refill_buffer(s);
      pbVar11 = s->img_buffer;
    }
    pbVar7 = pbVar11 + 1;
    s->img_buffer = pbVar7;
    bVar9 = *pbVar11;
    uVar19 = (ulong)bVar9;
    if ((4 < bVar9) || ((0x1aU >> (bVar9 & 0x1f) & 1) == 0)) {
LAB_0014167e:
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar9;
    uVar10 = (ulong)(uint)bVar9;
    ppsVar12 = &z->img_comp[0].data;
    do {
      *ppsVar12 = (stbi_uc *)0x0;
      ppsVar12[3] = (stbi_uc *)0x0;
      ppsVar12 = ppsVar12 + 0xc;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    if (uVar2 == (uint)bVar9 + (uint)bVar9 * 2 + 8) {
      z->rgb = 0;
      piVar14 = &z->img_comp[0].tq;
      lVar16 = 0;
      do {
        iVar18 = (int)uVar19;
        if (pbVar7 < s->img_buffer_end) {
LAB_0014158a:
          s->img_buffer = pbVar7 + 1;
          bVar9 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar7 = s->img_buffer;
            iVar18 = s->img_n;
            goto LAB_0014158a;
          }
          bVar9 = 0;
        }
        ((anon_struct_96_18_0d0905d3 *)(piVar14 + -3))->id = (uint)bVar9;
        if ((iVar18 == 3) && (bVar9 == "RGB"[lVar16])) {
          z->rgb = z->rgb + 1;
        }
        if (s->img_buffer_end <= pbVar7) {
          if (s->read_from_callbacks == 0) {
            piVar14[-2] = 0;
            goto LAB_0014190a;
          }
          stbi__refill_buffer(s);
          pbVar7 = s->img_buffer;
        }
        pbVar11 = pbVar7 + 1;
        s->img_buffer = pbVar11;
        bVar9 = *pbVar7;
        piVar14[-2] = (uint)(bVar9 >> 4);
        if ((byte)(bVar9 + 0xb0) < 0xc0) goto LAB_0014190a;
        piVar14[-1] = bVar9 & 0xf;
        if ((bVar9 & 0xf) - 5 < 0xfffffffc) goto LAB_001418ef;
        if (pbVar11 < s->img_buffer_end) {
LAB_00141636:
          s->img_buffer = pbVar11 + 1;
          bVar9 = *pbVar11;
          *piVar14 = (uint)bVar9;
          pbVar7 = pbVar11 + 1;
          if (3 < bVar9) {
            stbi__g_failure_reason = "bad TQ";
            return 0;
          }
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar11 = s->img_buffer;
            goto LAB_00141636;
          }
          *piVar14 = 0;
          pbVar7 = pbVar11;
        }
        lVar16 = lVar16 + 1;
        iVar18 = s->img_n;
        uVar19 = (ulong)iVar18;
        piVar14 = piVar14 + 0x18;
      } while (lVar16 < (long)uVar19);
      if (scan != 0) {
        return 1;
      }
      sVar3 = s->img_x;
      b = s->img_y;
      iVar4 = stbi__mad3sizes_valid(sVar3,b,iVar18,0);
      if (iVar4 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      uVar15 = 1;
      uVar2 = 1;
      if (0 < iVar18) {
        uVar15 = 1;
        lVar16 = 0;
        uVar2 = 1;
        do {
          uVar5 = *(uint *)((long)&z->img_comp[0].h + lVar16);
          uVar13 = *(uint *)((long)&z->img_comp[0].v + lVar16);
          if ((int)uVar2 < (int)uVar5) {
            uVar2 = uVar5;
          }
          if ((int)uVar15 < (int)uVar13) {
            uVar15 = uVar13;
          }
          lVar16 = lVar16 + 0x60;
        } while (uVar19 * 0x60 != lVar16);
        if (0 < iVar18) {
          lVar16 = 0;
          do {
            if ((int)uVar2 % *(int *)((long)&z->img_comp[0].h + lVar16) != 0) {
LAB_0014190a:
              stbi__g_failure_reason = "bad H";
              return 0;
            }
            if ((int)uVar15 % *(int *)((long)&z->img_comp[0].v + lVar16) != 0) {
LAB_001418ef:
              stbi__g_failure_reason = "bad V";
              return 0;
            }
            lVar16 = lVar16 + 0x60;
          } while (uVar19 * 0x60 != lVar16);
        }
      }
      uVar13 = ((sVar3 + uVar2 * 8) - 1) / (uVar2 * 8);
      uVar5 = ((b + uVar15 * 8) - 1) / (uVar15 * 8);
      z->img_h_max = uVar2;
      z->img_v_max = uVar15;
      z->img_mcu_w = uVar2 * 8;
      z->img_mcu_h = uVar15 * 8;
      z->img_mcu_x = uVar13;
      z->img_mcu_y = uVar5;
      if (iVar18 < 1) {
        return 1;
      }
      local_64 = 1;
      lVar16 = 0;
      while( true ) {
        iVar4 = *(int *)((long)&z->img_comp[0].h + lVar16);
        iVar17 = *(int *)((long)&z->img_comp[0].v + lVar16);
        *(uint *)((long)&z->img_comp[0].x + lVar16) = (iVar4 * sVar3 + (uVar2 - 1)) / uVar2;
        *(uint *)((long)&z->img_comp[0].y + lVar16) = (iVar17 * b + (uVar15 - 1)) / uVar15;
        iVar4 = iVar4 * uVar13;
        a = iVar4 * 8;
        *(int *)((long)&z->img_comp[0].w2 + lVar16) = a;
        iVar17 = iVar17 * uVar5;
        iVar18 = iVar17 * 8;
        *(int *)((long)&z->img_comp[0].h2 + lVar16) = iVar18;
        pvVar8 = stbi__malloc_mad2(a,iVar18,0xf);
        puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar16);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar16) = 0;
        *(void **)((long)&z->img_comp[0].raw_data + lVar16) = pvVar8;
        why = extraout_EDX;
        if (pvVar8 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].data + lVar16) = (long)pvVar8 + 0xfU & 0xfffffffffffffff0;
        if (z->progressive != 0) {
          *(int *)((long)&z->img_comp[0].coeff_w + lVar16) = iVar4;
          *(int *)((long)&z->img_comp[0].coeff_h + lVar16) = iVar17;
          pvVar8 = stbi__malloc_mad3(a,iVar18,2,0xf);
          *(void **)((long)&z->img_comp[0].raw_coeff + lVar16) = pvVar8;
          why = extraout_EDX_00;
          if (pvVar8 == (void *)0x0) break;
          *(ulong *)((long)&z->img_comp[0].coeff + lVar16) =
               (long)pvVar8 + 0xfU & 0xfffffffffffffff0;
        }
        local_64 = local_64 + 1;
        lVar16 = lVar16 + 0x60;
        if (uVar19 * 0x60 == lVar16) {
          return 1;
        }
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,local_64,why);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}